

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall fasttext::Dictionary::initTableDiscard(Dictionary *this)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  
  std::vector<float,_std::allocator<float>_>::resize(&this->pdiscard_,(long)this->size_);
  if (this->size_ != 0) {
    lVar2 = 8;
    uVar3 = 0;
    dVar1 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->t
    ;
    do {
      dVar6 = (double)((float)*(long *)((long)&(((this->words_).
                                                 super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->word).
                                               _M_dataplus._M_p + lVar2 * 4) / (float)this->ntokens_
                      );
      auVar5._0_8_ = dVar1 / dVar6;
      auVar5._8_8_ = 0;
      if (auVar5._0_8_ < 0.0) {
        dVar4 = sqrt(auVar5._0_8_);
      }
      else {
        auVar5 = vsqrtsd_avx(auVar5,auVar5);
        dVar4 = auVar5._0_8_;
      }
      lVar2 = lVar2 + 0x12;
      dVar1 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->t;
      (this->pdiscard_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = (float)(dVar4 + dVar1 / dVar6);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)(long)this->size_);
  }
  return;
}

Assistant:

void Dictionary::initTableDiscard() {
  pdiscard_.resize(size_);
  for (size_t i = 0; i < size_; i++) {
    real f = real(words_[i].count) / real(ntokens_);
    pdiscard_[i] = std::sqrt(args_->t / f) + args_->t / f;
  }
}